

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<std::error_code_()>::Action
          (Action<std::error_code_()> *this,ActionInterface<std::error_code_()> *impl)

{
  __shared_ptr<testing::ActionInterface<std::error_code()>,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<testing::ActionInterface<std::error_code()>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<testing::ActionInterface<std::error_code()>,void>(local_20,impl);
  std::function<std::error_code()>::function<testing::Action<std::error_code()>::ActionAdapter,void>
            ((function<std::error_code()> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}